

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

bool QUtil::is_number(char *p)

{
  bool bVar1;
  bool bVar2;
  bool local_1a;
  bool found_digit;
  char *pcStack_18;
  bool found_dot;
  char *p_local;
  
  if (*p == '\0') {
    p_local._7_1_ = false;
  }
  else {
    if ((*p == '-') || (pcStack_18 = p, *p == '+')) {
      pcStack_18 = p + 1;
    }
    bVar1 = false;
    local_1a = false;
    for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
      if (*pcStack_18 == '.') {
        if (bVar1) {
          return false;
        }
        bVar1 = true;
      }
      else {
        bVar2 = ::qpdf::util::is_digit(*pcStack_18);
        if (!bVar2) {
          return false;
        }
        local_1a = true;
      }
    }
    p_local._7_1_ = local_1a;
  }
  return p_local._7_1_;
}

Assistant:

bool
QUtil::is_number(char const* p)
{
    // No longer used by qpdf.

    // ^[\+\-]?(\.\d*|\d+(\.\d*)?)$
    if (!*p) {
        return false;
    }
    if ((*p == '-') || (*p == '+')) {
        ++p;
    }
    bool found_dot = false;
    bool found_digit = false;
    for (; *p; ++p) {
        if (*p == '.') {
            if (found_dot) {
                // only one dot
                return false;
            }
            found_dot = true;
        } else if (util::is_digit(*p)) {
            found_digit = true;
        } else {
            return false;
        }
    }
    return found_digit;
}